

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall llvm::cl::OptionCategory::registerCategory(OptionCategory *this)

{
  size_t __n;
  int iVar1;
  CommandLineParser *pCVar2;
  OptionCategory *pOVar3;
  SmallPtrSet<llvm::cl::OptionCategory_*,_16U> *this_00;
  long lVar4;
  bool bVar5;
  SmallPtrSetIteratorImpl SVar6;
  iterator iVar7;
  SmallPtrSetIteratorImpl local_58;
  pair<llvm::SmallPtrSetIterator<llvm::cl::OptionCategory_*>,_bool> local_48;
  
  pCVar2 = ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
           ::operator->((ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
                         *)this);
  this_00 = &pCVar2->RegisteredOptionCategories;
  SVar6 = (SmallPtrSetIteratorImpl)
          SmallPtrSetImpl<llvm::cl::OptionCategory_*>::begin
                    (&this_00->super_SmallPtrSetImpl<llvm::cl::OptionCategory_*>);
  iVar7 = SmallPtrSetImpl<llvm::cl::OptionCategory_*>::end
                    (&this_00->super_SmallPtrSetImpl<llvm::cl::OptionCategory_*>);
  lVar4 = 0;
  local_58.Bucket = SVar6.Bucket;
  while (local_58 = SVar6, bVar5 = local_58.Bucket != iVar7.super_SmallPtrSetIteratorImpl.Bucket,
        bVar5) {
    local_48.first.super_SmallPtrSetIteratorImpl.End = local_58.End;
    local_48.first.super_SmallPtrSetIteratorImpl.Bucket = local_58.Bucket;
    pOVar3 = SmallPtrSetIterator<llvm::cl::OptionCategory_*>::operator*(&local_48.first);
    __n = (this->Name).Length;
    if (__n == (pOVar3->Name).Length) {
      if (__n == 0) {
        lVar4 = lVar4 + 1;
      }
      else {
        iVar1 = bcmp((this->Name).Data,(pOVar3->Name).Data,__n);
        lVar4 = lVar4 + (ulong)(iVar1 == 0);
      }
    }
    SmallPtrSetIterator<llvm::cl::OptionCategory_*>::operator++
              ((SmallPtrSetIterator<llvm::cl::OptionCategory_*> *)&local_58);
    SVar6 = local_58;
  }
  if (lVar4 == 0) {
    SmallPtrSetImpl<llvm::cl::OptionCategory_*>::insert
              (&local_48,&this_00->super_SmallPtrSetImpl<llvm::cl::OptionCategory_*>,this);
    return;
  }
  __assert_fail("count_if(RegisteredOptionCategories, [cat](const OptionCategory *Category) { return cat->getName() == Category->getName(); }) == 0 && \"Duplicate option categories\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                ,0x11a,
                "void (anonymous namespace)::CommandLineParser::registerCategory(OptionCategory *)")
  ;
}

Assistant:

void OptionCategory::registerCategory() {
  GlobalParser->registerCategory(this);
}